

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

string * __thiscall adios2::Engine::Type_abi_cxx11_(string *__return_storage_ptr__,Engine *this)

{
  Engine *pointer;
  allocator local_41;
  string local_40;
  
  pointer = this->m_Engine;
  std::__cxx11::string::string((string *)&local_40,"in call to Engine::Type",&local_41);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this->m_Engine + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string Engine::Type() const
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::Type");
    return m_Engine->m_EngineType;
}